

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O2

bool __thiscall
NewEdgeCalculator::similarityCriterion
          (NewEdgeCalculator *this,AlignmentRecord *a1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          AlignmentRecord *a2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          double probM,double prob0,int tc,int cc)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  long lStack_a0;
  string local_88;
  double local_68;
  double local_60;
  double local_58;
  string local_50;
  
  local_68 = prob0;
  local_58 = probM;
  AlignmentRecord::getName_abi_cxx11_(&local_88,a1);
  lVar2 = std::__cxx11::string::find((char *)&local_88,0x1ae81e);
  if (lVar2 == -1) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    AlignmentRecord::getName_abi_cxx11_(&local_50,a2);
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x1ae81e);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    if (lVar2 != -1) {
      lStack_a0 = 0x30;
      goto LAB_0017a045;
    }
  }
  AlignmentRecord::getName_abi_cxx11_(&local_88,a1);
  lVar2 = std::__cxx11::string::find((char *)&local_88,0x1ae81e);
  if (lVar2 == -1) {
    AlignmentRecord::getName_abi_cxx11_(&local_50,a2);
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x1ae81e);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    lStack_a0 = (ulong)(lVar2 == -1) * 8 + 0x20;
  }
  else {
    std::__cxx11::string::~string((string *)&local_88);
    lStack_a0 = 0x20;
  }
LAB_0017a045:
  local_60 = log10(*(double *)((long)&(this->super_EdgeCalculator)._vptr_EdgeCalculator + lStack_a0)
                  );
  AlignmentRecord::getName_abi_cxx11_(&local_88,a1);
  lVar2 = std::__cxx11::string::find((char *)&local_88,0x1ae81e);
  if (lVar2 == -1) {
    lVar2 = 0x10;
  }
  else {
    AlignmentRecord::getName_abi_cxx11_(&local_50,a2);
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x1ae81e);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = (ulong)(lVar2 == -1) * 8 + 8;
  }
  std::__cxx11::string::~string((string *)&local_88);
  dVar7 = (double)cc;
  uVar3 = ((long)(cov_ap1->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(cov_ap1->
                super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar4 = ((long)(cov_ap2->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(cov_ap2->
                super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  auVar6._8_4_ = (int)(uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  if (dVar7 <= ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
               *(double *)((long)&(this->super_EdgeCalculator)._vptr_EdgeCalculator + lVar2)) {
    bVar1 = false;
  }
  else {
    bVar1 = this->NOPROB0;
    if (bVar1 == false) {
      dVar7 = (double)(cc + tc);
    }
    dVar5 = log10(local_58);
    if (bVar1 == false) {
      dVar5 = dVar5 + local_68;
    }
    bVar1 = local_60 <= (1.0 / dVar7) * dVar5;
  }
  return bVar1;
}

Assistant:

bool NewEdgeCalculator::similarityCriterion(const AlignmentRecord & a1, const std::vector<AlignmentRecord::mapValue> &cov_ap1, const AlignmentRecord & a2, const std::vector<AlignmentRecord::mapValue> &cov_ap2, double probM, double prob0, int tc, int cc) const{

    //Threshold for probability that reads were sampled from same haplotype
    double cutoff = 0;
    if (a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos) {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF);
    } else if (a1.getName().find("Clique") != string::npos || a2.getName().find("Clique") != string::npos) {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF_MIXED);
    } else {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF_SINGLE);
    }

    //Threshold for Overlap of Read Alignments
    double MIN_OVERLAP = 0;
    if (a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos) {
        MIN_OVERLAP = MIN_OVERLAP_CLIQUES;
    } else {
        MIN_OVERLAP = MIN_OVERLAP_SINGLE;
    }
    //double ratio = (float)cc/tc;
    if (cc<=MIN_OVERLAP*std::min(cov_ap1.size(),cov_ap2.size())) return false;
    double prob;
    double potence;
    /*if((double)cc/tc<=0.15 && probM >= 0.8 && MIN_OVERLAP==0.1){
        prob = probM;
        potence = 1.0/(cc);
    } else {*/
    //TEST to see what happens if prob0 is neglected
    if(this->NOPROB0){
        prob = std::log10(probM);
        potence = 1.0/cc;
    } else {
        prob = std::log10(probM) + prob0;
        potence = 1.0/(cc+tc);
    }
    //}
    double final_prob = prob*potence;
    //cout << "Final prob: " << final_prob << endl;
    return final_prob >= cutoff;
}